

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_object_list_find(JSContext *ctx,JSObjectList *s,JSObject *obj)

{
  uint32_t uVar1;
  long *plVar2;
  JSObject *in_RDX;
  long *in_RSI;
  uint32_t p;
  uint32_t h;
  JSObjectListEntry *e;
  uint local_30;
  
  if ((int)in_RSI[1] != 0) {
    uVar1 = js_object_list_get_hash(in_RDX,*(uint32_t *)(in_RSI + 3));
    local_30 = *(uint *)(in_RSI[2] + (ulong)uVar1 * 4);
    while (local_30 != 0xffffffff) {
      plVar2 = (long *)(*in_RSI + (ulong)local_30 * 0x10);
      if ((JSObject *)*plVar2 == in_RDX) {
        return local_30;
      }
      local_30 = *(uint *)(plVar2 + 1);
    }
  }
  return -1;
}

Assistant:

static int js_object_list_find(JSContext *ctx, JSObjectList *s, JSObject *obj)
{
    JSObjectListEntry *e;
    uint32_t h, p;

    /* must test empty size because there is no hash table */
    if (s->object_count == 0)
        return -1;
    h = js_object_list_get_hash(obj, s->hash_size); 
    p = s->hash_table[h];
    while (p != -1) {
        e = &s->object_tab[p];
        if (e->obj == obj)
            return p;
        p = e->hash_next;
    }
    return -1;
}